

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvagetbios.c
# Opt level: O2

int nv_cksum(uint8_t *data,uint length)

{
  ulong uVar1;
  char cVar2;
  
  cVar2 = '\0';
  for (uVar1 = 0; length != uVar1; uVar1 = uVar1 + 1) {
    cVar2 = cVar2 + data[uVar1];
  }
  if (cVar2 == '\0') {
    return 1;
  }
  fwrite("Invalid checksum. Broken vbios or broken retrieval method?\n",0x3b,1,_stderr);
  return -1;
}

Assistant:

static int nv_cksum(const uint8_t *data, unsigned int length)
{
	/*
	 * There's a few checksums in the BIOS, so here's a generic checking
	 * function.
	 */
	int i;
	uint8_t sum = 0;

	for (i = 0; i < length; i++)
		sum += data[i];

	if (sum) {
		fprintf(stderr, "Invalid checksum. Broken vbios or broken retrieval method?\n");
		return ECRC;
	}
	return EOK;
}